

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetInteger64Verifier::verifyIntegerAnyOf
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLint *references,
          size_t referencesLength)

{
  ostringstream *this_00;
  bool bVar1;
  size_t sVar2;
  StateQueryMemoryWriteGuard<long> state;
  StateQueryMemoryWriteGuard<long> local_1b8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1b8.m_postguard = -0x2121212121212122;
  local_1b8.m_preguard = -0x2121212121212122;
  local_1b8.m_value = -0x2121212121212122;
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_1b8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    (&local_1b8,testCtx);
  if (bVar1) {
    if (referencesLength != 0) {
      sVar2 = 0;
      do {
        if (local_1b8.m_value == references[sVar2]) {
          return;
        }
        sVar2 = sVar2 + 1;
      } while (referencesLength != sVar2);
    }
    local_198._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"// ERROR: got ",0xe);
    std::ostream::_M_insert<long>((long)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyIntegerAnyOf (tcu::TestContext& testCtx, GLenum name, const GLint references[], size_t referencesLength)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	for (size_t ndx = 0; ndx < referencesLength; ++ndx)
	{
		const GLint64 expectedGLState = GLint64(references[ndx]);

		if (state == expectedGLState)
			return;
	}

	testCtx.getLog() << TestLog::Message << "// ERROR: got " << state << TestLog::EndMessage;
	if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
}